

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O0

int __thiscall gl4cts::TextureBarrierBaseTest::init(TextureBarrierBaseTest *this,EVP_PKEY_CTX *ctx)

{
  NotSupportedError *this_00;
  bool bVar1;
  undefined3 extraout_var;
  allocator<char> local_31;
  string local_30;
  TextureBarrierBaseTest *local_10;
  TextureBarrierBaseTest *this_local;
  
  local_10 = this;
  bVar1 = featureSupported(this);
  if (!bVar1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Required texture_barrier extension is not supported",&local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  return CONCAT31(extraout_var,bVar1);
}

Assistant:

virtual void init()
	{
		if (!featureSupported())
		{
			throw tcu::NotSupportedError("Required texture_barrier extension is not supported");
		}
	}